

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O2

void Abc_WriteMulti(FILE *pFile,int nVars)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar1 = Abc_Base10Log(nVars);
  uVar8 = (ulong)uVar1;
  uVar1 = nVars * 2;
  uVar2 = Abc_Base10Log(uVar1);
  if (0 < nVars) {
    uVar9 = (ulong)uVar2;
    fprintf((FILE *)pFile,".model Multi%d\n",(ulong)(uint)nVars);
    fwrite(".inputs",7,1,(FILE *)pFile);
    for (uVar4 = 0; nVars != uVar4; uVar4 = uVar4 + 1) {
      fprintf((FILE *)pFile," a%0*d",uVar8,(ulong)uVar4);
    }
    for (uVar4 = 0; nVars != uVar4; uVar4 = uVar4 + 1) {
      fprintf((FILE *)pFile," b%0*d",uVar8,(ulong)uVar4);
    }
    fputc(10,(FILE *)pFile);
    fwrite(".outputs",8,1,(FILE *)pFile);
    for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
      fprintf((FILE *)pFile," m%0*d",uVar9,(ulong)uVar4);
    }
    fputc(10,(FILE *)pFile);
    for (uVar6 = 0; uVar1 != (uint)uVar6; uVar6 = (ulong)((uint)uVar6 + 1)) {
      fprintf((FILE *)pFile,".names x%0*d_%0*d\n",uVar8,0,(ulong)uVar2,uVar6);
    }
    iVar3 = 0;
    uVar6 = 0;
    while( true ) {
      uVar4 = (uint)uVar6;
      if (uVar4 == nVars) break;
      uVar7 = 0;
      while (uVar5 = (uint)uVar7, uVar1 != uVar5) {
        if ((int)uVar5 < (int)(uVar4 + nVars) && uVar4 <= uVar5) {
          fprintf((FILE *)pFile,".names b%0*d a%0*d y%0*d_%0*d\n11 1\n",uVar8,uVar6,uVar8,
                  (ulong)(iVar3 + uVar5),uVar8,uVar6,uVar9,uVar7);
        }
        else {
          fprintf((FILE *)pFile,".names y%0*d_%0*d\n",uVar8,uVar6,(ulong)uVar2,uVar7);
        }
        uVar7 = (ulong)(uVar5 + 1);
      }
      fprintf((FILE *)pFile,".subckt ADD%d",(ulong)uVar1);
      for (uVar7 = 0; uVar1 != (uint)uVar7; uVar7 = (ulong)((uint)uVar7 + 1)) {
        fprintf((FILE *)pFile," a%0*d=x%0*d_%0*d",(ulong)uVar2,uVar7,uVar8,uVar6,uVar9,uVar7);
      }
      for (uVar7 = 0; uVar1 != (uint)uVar7; uVar7 = (ulong)((uint)uVar7 + 1)) {
        fprintf((FILE *)pFile," b%0*d=y%0*d_%0*d",(ulong)uVar2,uVar7,uVar8,uVar6,uVar9,uVar7);
      }
      uVar6 = (ulong)(uVar4 + 1);
      for (uVar7 = 0; uVar1 + 1 != (int)uVar7; uVar7 = (ulong)((int)uVar7 + 1)) {
        fprintf((FILE *)pFile," s%0*d=x%0*d_%0*d",(ulong)uVar2,uVar7,uVar8,uVar6,uVar9,uVar7);
      }
      fputc(10,(FILE *)pFile);
      iVar3 = iVar3 + -1;
    }
    for (uVar6 = 0; uVar1 != (uint)uVar6; uVar6 = (ulong)((uint)uVar6 + 1)) {
      fprintf((FILE *)pFile,".names x%0*d_%0*d m%0*d\n1 1\n",uVar8,(ulong)(uint)nVars,(ulong)uVar2,
              uVar6,uVar9,uVar6);
    }
    fwrite(".end\n",5,1,(FILE *)pFile);
    fputc(10,(FILE *)pFile);
    Abc_WriteAdder(pFile,uVar1);
    return;
  }
  __assert_fail("nVars > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcGen.c"
                ,0x90,"void Abc_WriteMulti(FILE *, int)");
}

Assistant:

void Abc_WriteMulti( FILE * pFile, int nVars )
{
    int i, k, nDigits = Abc_Base10Log( nVars ), nDigits2 = Abc_Base10Log( 2*nVars );

    assert( nVars > 0 );
    fprintf( pFile, ".model Multi%d\n", nVars );

    fprintf( pFile, ".inputs" );
    for ( i = 0; i < nVars; i++ )
        fprintf( pFile, " a%0*d", nDigits, i );
    for ( i = 0; i < nVars; i++ )
        fprintf( pFile, " b%0*d", nDigits, i );
    fprintf( pFile, "\n" );

    fprintf( pFile, ".outputs" );
    for ( i = 0; i < 2*nVars; i++ )
        fprintf( pFile, " m%0*d", nDigits2, i );
    fprintf( pFile, "\n" );

    for ( i = 0; i < 2*nVars; i++ )
        fprintf( pFile, ".names x%0*d_%0*d\n", nDigits, 0, nDigits2, i );
    for ( k = 0; k < nVars; k++ )
    {
        for ( i = 0; i < 2 * nVars; i++ )
            if ( i >= k && i < k + nVars )
                fprintf( pFile, ".names b%0*d a%0*d y%0*d_%0*d\n11 1\n", nDigits, k, nDigits, i-k, nDigits, k, nDigits2, i );
            else
                fprintf( pFile, ".names y%0*d_%0*d\n", nDigits, k, nDigits2, i );
        fprintf( pFile, ".subckt ADD%d", 2*nVars );
        for ( i = 0; i < 2*nVars; i++ )
            fprintf( pFile, " a%0*d=x%0*d_%0*d", nDigits2, i, nDigits, k, nDigits2, i );
        for ( i = 0; i < 2*nVars; i++ )
            fprintf( pFile, " b%0*d=y%0*d_%0*d", nDigits2, i, nDigits, k, nDigits2, i );
        for ( i = 0; i <= 2*nVars; i++ )
            fprintf( pFile, " s%0*d=x%0*d_%0*d", nDigits2, i, nDigits, k+1, nDigits2, i );
        fprintf( pFile, "\n" );
    }
    for ( i = 0; i < 2 * nVars; i++ )
        fprintf( pFile, ".names x%0*d_%0*d m%0*d\n1 1\n", nDigits, k, nDigits2, i, nDigits2, i );
    fprintf( pFile, ".end\n" ); 
    fprintf( pFile, "\n" );
    Abc_WriteAdder( pFile, 2*nVars );
}